

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O0

uint64_t load_helper(CPUArchState_conflict28 *env,target_ulong_conflict addr,TCGMemOpIdx oi,
                    uintptr_t retaddr,MemOp op,_Bool code_read,FullLoadHelper_conflict14 *full_load)

{
  int iVar1;
  uc_struct *puVar2;
  char cVar3;
  _Bool _Var4;
  byte bVar5;
  uint uVar6;
  MMUAccessType access_type_00;
  MemOp memop;
  uint uVar7;
  uint size_00;
  ulong mmu_idx_00;
  size_t elt_ofs;
  ulong len;
  CPUState *pCVar8;
  CPUTLB_conflict5 *pCVar9;
  CPUIOTLBEntry *iotlbentry_00;
  void *haddr_00;
  uint64_t uVar10;
  uint64_t uVar11;
  bool bVar12;
  bool local_f2;
  uint local_f0;
  uint local_e8;
  uint local_e0;
  target_ulong_conflict local_dc;
  int old_size;
  uint shift;
  uint64_t r2;
  uint64_t r1;
  target_ulong_conflict addr2;
  target_ulong_conflict addr1;
  _Bool need_swap;
  CPUIOTLBEntry *iotlbentry;
  MemoryRegion_conflict *mr;
  uc_struct_conflict15 *uc;
  list_item *cur;
  long lStack_88;
  _Bool handled;
  hook *hook;
  int error_code;
  size_t size;
  uint64_t res;
  void *haddr;
  uint a_bits;
  MMUAccessType access_type;
  size_t tlb_off;
  target_ulong_conflict paddr;
  target_ulong_conflict tlb_addr;
  CPUTLBEntry *entry;
  uintptr_t index;
  uintptr_t mmu_idx;
  _Bool code_read_local;
  MemOp op_local;
  uintptr_t retaddr_local;
  TCGMemOpIdx oi_local;
  target_ulong_conflict addr_local;
  CPUArchState_conflict28 *env_local;
  
  uVar6 = get_mmuidx(oi);
  mmu_idx_00 = (ulong)uVar6;
  entry = (CPUTLBEntry *)tlb_index(env,mmu_idx_00,addr);
  _paddr = tlb_entry(env,mmu_idx_00,addr);
  if (code_read) {
    local_dc = (_paddr->field_0).field_0.addr_write;
  }
  else {
    local_dc = (_paddr->field_0).field_0.addr_read;
  }
  tlb_off._4_4_ = local_dc;
  elt_ofs = 0;
  if (code_read) {
    elt_ofs = 8;
  }
  access_type_00 = MMU_DATA_LOAD;
  if (code_read) {
    access_type_00 = MMU_INST_FETCH;
  }
  memop = get_memop(oi);
  uVar7 = get_alignment_bits(memop);
  size_00 = memop_size(op);
  len = (ulong)size_00;
  puVar2 = (uc_struct *)env->uc;
  if ((addr & (1 << ((byte)uVar7 & 0x1f)) - 1U) != 0) {
    pCVar8 = env_cpu(env);
    cpu_unaligned_access(pCVar8,(ulong)addr,access_type_00,uVar6,retaddr);
  }
  _Var4 = tlb_hit(env->uc,local_dc,addr);
  if (!_Var4) {
    _Var4 = victim_tlb_hit(env,mmu_idx_00,(size_t)entry,elt_ofs,addr & 0xffffc000);
    if (!_Var4) {
      pCVar8 = env_cpu(env);
      tlb_fill(pCVar8,addr,size_00,access_type_00,uVar6,retaddr);
      entry = (CPUTLBEntry *)tlb_index(env,mmu_idx_00,addr);
      _paddr = tlb_entry(env,mmu_idx_00,addr);
    }
    if (code_read) {
      local_e0 = (_paddr->field_0).field_0.addr_write;
    }
    else {
      local_e0 = (_paddr->field_0).field_0.addr_read;
    }
    tlb_off._4_4_ = local_e0 & 0xffffdfff;
  }
  tlb_off._0_4_ = *(uint *)((long)&_paddr->field_0 + 0xc) | addr & 0x3fff;
  iotlbentry = (CPUIOTLBEntry *)(*puVar2->memory_mapping)(puVar2,(hwaddr)(uint)tlb_off);
  if ((MemoryRegion *)iotlbentry == (MemoryRegion *)0x0) {
    cur._7_1_ = 0;
    if (puVar2->invalid_error == 0) {
      if (code_read) {
        hook._4_4_ = 8;
        uc = (uc_struct_conflict15 *)puVar2->hook[6].head;
        while( true ) {
          bVar12 = false;
          if (uc != (uc_struct_conflict15 *)0x0) {
            lStack_88 = *(long *)&uc->errnum;
            bVar12 = lStack_88 != 0;
          }
          if (!bVar12) break;
          if ((((*(byte *)(lStack_88 + 0x14) & 1) == 0) &&
              (((*(ulong *)(lStack_88 + 0x18) <= (ulong)(uint)tlb_off &&
                ((ulong)(uint)tlb_off <= *(ulong *)(lStack_88 + 0x20))) ||
               (*(ulong *)(lStack_88 + 0x20) < *(ulong *)(lStack_88 + 0x18))))) &&
             ((*(byte *)(lStack_88 + 0x14) & 1) == 0)) {
            bVar5 = (**(code **)(lStack_88 + 0x28))
                              (puVar2,0x15,(uint)tlb_off,len,0,*(undefined8 *)(lStack_88 + 0x30));
            cur._7_1_ = bVar5 & 1;
            if (((bVar5 & 1) != 0) || ((puVar2->stop_request & 1U) != 0)) break;
          }
          uc = *(uc_struct_conflict15 **)uc;
        }
      }
      else {
        hook._4_4_ = 6;
        uc = (uc_struct_conflict15 *)puVar2->hook[4].head;
        while( true ) {
          bVar12 = false;
          if (uc != (uc_struct_conflict15 *)0x0) {
            lStack_88 = *(long *)&uc->errnum;
            bVar12 = lStack_88 != 0;
          }
          if (!bVar12) break;
          if ((((*(byte *)(lStack_88 + 0x14) & 1) == 0) &&
              (((*(ulong *)(lStack_88 + 0x18) <= (ulong)(uint)tlb_off &&
                ((ulong)(uint)tlb_off <= *(ulong *)(lStack_88 + 0x20))) ||
               (*(ulong *)(lStack_88 + 0x20) < *(ulong *)(lStack_88 + 0x18))))) &&
             ((*(byte *)(lStack_88 + 0x14) & 1) == 0)) {
            bVar5 = (**(code **)(lStack_88 + 0x28))
                              (puVar2,0x13,(uint)tlb_off,len,0,*(undefined8 *)(lStack_88 + 0x30));
            cur._7_1_ = bVar5 & 1;
            if (((bVar5 & 1) != 0) || ((puVar2->stop_request & 1U) != 0)) break;
          }
          uc = *(uc_struct_conflict15 **)uc;
        }
      }
    }
    else {
      hook._4_4_ = puVar2->invalid_error;
    }
    if (cur._7_1_ == 0) {
      puVar2->invalid_addr = (ulong)(uint)tlb_off;
      puVar2->invalid_error = hook._4_4_;
      if ((0 < puVar2->nested_level) && ((puVar2->cpu->stopped & 1U) == 0)) {
        cpu_exit(puVar2->cpu);
        cpu_loop_exit_tricore(puVar2->cpu);
      }
      return 0;
    }
    puVar2->invalid_error = 0;
    _Var4 = tlb_hit(env->uc,tlb_off._4_4_,addr);
    if (!_Var4) {
      _Var4 = victim_tlb_hit(env,mmu_idx_00,(size_t)entry,elt_ofs,addr & 0xffffc000);
      if (!_Var4) {
        pCVar8 = env_cpu(env);
        tlb_fill(pCVar8,addr,size_00,access_type_00,uVar6,retaddr);
        entry = (CPUTLBEntry *)tlb_index(env,mmu_idx_00,addr);
        _paddr = tlb_entry(env,mmu_idx_00,addr);
      }
      if (code_read) {
        local_e8 = (_paddr->field_0).field_0.addr_write;
      }
      else {
        local_e8 = (_paddr->field_0).field_0.addr_read;
      }
      tlb_off._4_4_ = local_e8 & 0xffffdfff;
    }
    tlb_off._0_4_ = *(uint *)((long)&_paddr->field_0 + 0xc) | addr & 0x3fff;
    iotlbentry = (CPUIOTLBEntry *)(*puVar2->memory_mapping)(puVar2,(hwaddr)(uint)tlb_off);
    if ((MemoryRegion *)iotlbentry == (MemoryRegion *)0x0) {
      puVar2->invalid_error = 0xb;
      if ((0 < puVar2->nested_level) && ((puVar2->cpu->stopped & 1U) == 0)) {
        cpu_exit(puVar2->cpu);
        cpu_loop_exit_tricore(puVar2->cpu);
      }
      return 0;
    }
  }
  if (code_read) {
    if ((iotlbentry != (CPUIOTLBEntry *)0x0) && (((uint)iotlbentry[8].attrs & 4) == 0)) {
      cur._7_1_ = 0;
      uc = (uc_struct_conflict15 *)puVar2->hook[9].head;
      while( true ) {
        bVar12 = false;
        if (uc != (uc_struct_conflict15 *)0x0) {
          lStack_88 = *(long *)&uc->errnum;
          bVar12 = lStack_88 != 0;
        }
        if (!bVar12) break;
        if ((((*(byte *)(lStack_88 + 0x14) & 1) == 0) &&
            (((*(ulong *)(lStack_88 + 0x18) <= (ulong)(uint)tlb_off &&
              ((ulong)(uint)tlb_off <= *(ulong *)(lStack_88 + 0x20))) ||
             (*(ulong *)(lStack_88 + 0x20) < *(ulong *)(lStack_88 + 0x18))))) &&
           ((*(byte *)(lStack_88 + 0x14) & 1) == 0)) {
          bVar5 = (**(code **)(lStack_88 + 0x28))
                            (puVar2,0x18,(uint)tlb_off,len,0,*(undefined8 *)(lStack_88 + 0x30));
          cur._7_1_ = bVar5 & 1;
          if (((bVar5 & 1) != 0) || ((puVar2->stop_request & 1U) != 0)) break;
        }
        uc = *(uc_struct_conflict15 **)uc;
      }
      if (cur._7_1_ == 0) {
        puVar2->invalid_addr = (ulong)(uint)tlb_off;
        puVar2->invalid_error = 0xe;
        if ((0 < puVar2->nested_level) && ((puVar2->cpu->stopped & 1U) == 0)) {
          cpu_exit(puVar2->cpu);
          cpu_loop_exit_tricore(puVar2->cpu);
        }
        return 0;
      }
      puVar2->invalid_error = 0;
    }
  }
  else {
    uc = (uc_struct_conflict15 *)puVar2->hook[10].head;
    while( true ) {
      bVar12 = false;
      if (uc != (uc_struct_conflict15 *)0x0) {
        lStack_88 = *(long *)&uc->errnum;
        bVar12 = lStack_88 != 0;
      }
      if ((!bVar12) ||
         (((*(byte *)(lStack_88 + 0x14) & 1) == 0 &&
          ((((*(ulong *)(lStack_88 + 0x18) <= (ulong)(uint)tlb_off &&
             ((ulong)(uint)tlb_off <= *(ulong *)(lStack_88 + 0x20))) ||
            (*(ulong *)(lStack_88 + 0x20) < *(ulong *)(lStack_88 + 0x18))) &&
           (((*(byte *)(lStack_88 + 0x14) & 1) == 0 &&
            ((**(code **)(lStack_88 + 0x28))
                       (env->uc,0x10,(uint)tlb_off,len,0,*(undefined8 *)(lStack_88 + 0x30)),
            (puVar2->stop_request & 1U) != 0)))))))) break;
      uc = *(uc_struct_conflict15 **)uc;
    }
    if ((iotlbentry != (CPUIOTLBEntry *)0x0) && (((uint)iotlbentry[8].attrs & 1) == 0)) {
      cur._7_1_ = 0;
      uc = (uc_struct_conflict15 *)puVar2->hook[7].head;
      while( true ) {
        bVar12 = false;
        if (uc != (uc_struct_conflict15 *)0x0) {
          lStack_88 = *(long *)&uc->errnum;
          bVar12 = lStack_88 != 0;
        }
        if (!bVar12) break;
        if ((((*(byte *)(lStack_88 + 0x14) & 1) == 0) &&
            (((*(ulong *)(lStack_88 + 0x18) <= (ulong)(uint)tlb_off &&
              ((ulong)(uint)tlb_off <= *(ulong *)(lStack_88 + 0x20))) ||
             (*(ulong *)(lStack_88 + 0x20) < *(ulong *)(lStack_88 + 0x18))))) &&
           ((*(byte *)(lStack_88 + 0x14) & 1) == 0)) {
          bVar5 = (**(code **)(lStack_88 + 0x28))
                            (puVar2,0x17,(uint)tlb_off,len,0,*(undefined8 *)(lStack_88 + 0x30));
          cur._7_1_ = bVar5 & 1;
          if (((bVar5 & 1) != 0) || ((puVar2->stop_request & 1U) != 0)) break;
        }
        uc = *(uc_struct_conflict15 **)uc;
      }
      if (cur._7_1_ == 0) {
        puVar2->invalid_addr = (ulong)(uint)tlb_off;
        puVar2->invalid_error = 0xd;
        if ((0 < puVar2->nested_level) && ((puVar2->cpu->stopped & 1U) == 0)) {
          cpu_exit(puVar2->cpu);
          cpu_loop_exit_tricore(puVar2->cpu);
        }
        return 0;
      }
      puVar2->invalid_error = 0;
      _Var4 = tlb_hit(env->uc,tlb_off._4_4_,addr);
      if (!_Var4) {
        _Var4 = victim_tlb_hit(env,mmu_idx_00,(size_t)entry,elt_ofs,addr & 0xffffc000);
        if (!_Var4) {
          pCVar8 = env_cpu(env);
          tlb_fill(pCVar8,addr,size_00,access_type_00,uVar6,retaddr);
          entry = (CPUTLBEntry *)tlb_index(env,mmu_idx_00,addr);
          _paddr = tlb_entry(env,mmu_idx_00,addr);
        }
        if (code_read) {
          local_f0 = (_paddr->field_0).field_0.addr_write;
        }
        else {
          local_f0 = (_paddr->field_0).field_0.addr_read;
        }
        tlb_off._4_4_ = local_f0 & 0xffffdfff;
      }
    }
  }
  if ((tlb_off._4_4_ & 0x3fff) == 0) {
    if ((len < 2) || (((addr & 0x3fff) + len) - 1 < 0x4000)) {
      size = load_memop((void *)((ulong)addr + *(long *)((long)&_paddr->field_0 + 0x10)),op);
      goto LAB_012f22f6;
    }
  }
  else if (((ulong)addr & len - 1) == 0) {
    pCVar9 = env_tlb(env);
    iotlbentry_00 = pCVar9->d[mmu_idx_00].iotlb + (long)entry;
    if ((tlb_off._4_4_ & 0x400) != 0) {
      pCVar8 = env_cpu(env);
      cpu_check_watchpoint_tricore(pCVar8,(ulong)addr,len,iotlbentry_00->attrs,1,retaddr);
    }
    bVar12 = (tlb_off._4_4_ & 0x200) != 0;
    local_f2 = 1 < len && bVar12;
    if ((tlb_off._4_4_ & 0x800) == 0) {
      haddr_00 = (void *)((ulong)addr + *(long *)((long)&_paddr->field_0 + 0x10));
      if (1 < len && bVar12) {
        size = load_memop(haddr_00,op ^ MO_BE);
      }
      else {
        size = load_memop(haddr_00,op);
      }
    }
    else {
      size = io_readx(env,iotlbentry_00,uVar6,addr,retaddr,access_type_00,op ^ (uint)local_f2 << 3);
    }
    goto LAB_012f22f6;
  }
  uVar6 = addr & (size_00 - 1 ^ 0xffffffff);
  iVar1 = puVar2->size_recur_mem;
  puVar2->size_recur_mem = size_00;
  uVar10 = (*full_load)(env,uVar6,oi,retaddr);
  uVar11 = (*full_load)(env,uVar6 + size_00,oi,retaddr);
  puVar2->size_recur_mem = iVar1;
  _Var4 = memop_big_endian(op);
  bVar5 = (byte)(((ulong)addr & len - 1) << 3);
  cVar3 = (char)size_00;
  if (_Var4) {
    size = uVar10 << (bVar5 & 0x3f) | uVar11 >> (cVar3 * '\b' - bVar5 & 0x3f);
  }
  else {
    size = uVar10 >> (bVar5 & 0x3f) | uVar11 << (cVar3 * '\b' - bVar5 & 0x3f);
  }
  size = size & 0xffffffffffffffffU >> (cVar3 * -8 + 0x40U & 0x3f);
LAB_012f22f6:
  if ((!code_read) && (puVar2->size_recur_mem == 0)) {
    uc = (uc_struct_conflict15 *)puVar2->hook[0xd].head;
    while( true ) {
      bVar12 = false;
      if (uc != (uc_struct_conflict15 *)0x0) {
        lStack_88 = *(long *)&uc->errnum;
        bVar12 = lStack_88 != 0;
      }
      if ((!bVar12) ||
         ((((*(byte *)(lStack_88 + 0x14) & 1) == 0 &&
           (((*(ulong *)(lStack_88 + 0x18) <= (ulong)(uint)tlb_off &&
             ((ulong)(uint)tlb_off <= *(ulong *)(lStack_88 + 0x20))) ||
            (*(ulong *)(lStack_88 + 0x20) < *(ulong *)(lStack_88 + 0x18))))) &&
          (((*(byte *)(lStack_88 + 0x14) & 1) == 0 &&
           ((**(code **)(lStack_88 + 0x28))
                      (env->uc,0x19,(uint)tlb_off,len,size,*(undefined8 *)(lStack_88 + 0x30)),
           (puVar2->stop_request & 1U) != 0)))))) break;
      uc = *(uc_struct_conflict15 **)uc;
    }
  }
  return size;
}

Assistant:

static uint64_t inline
load_helper(CPUArchState *env, target_ulong addr, TCGMemOpIdx oi,
            uintptr_t retaddr, MemOp op, bool code_read,
            FullLoadHelper *full_load)
{
    uintptr_t mmu_idx = get_mmuidx(oi);
    uintptr_t index = tlb_index(env, mmu_idx, addr);
    CPUTLBEntry *entry = tlb_entry(env, mmu_idx, addr);
    target_ulong tlb_addr = code_read ? entry->addr_code : entry->addr_read;
    target_ulong paddr;
    const size_t tlb_off = code_read ?
        offsetof(CPUTLBEntry, addr_code) : offsetof(CPUTLBEntry, addr_read);
    const MMUAccessType access_type =
        code_read ? MMU_INST_FETCH : MMU_DATA_LOAD;
    unsigned a_bits = get_alignment_bits(get_memop(oi));
    void *haddr;
    uint64_t res;
    size_t size = memop_size(op);
    int error_code;
    struct hook *hook;
    bool handled;
    HOOK_FOREACH_VAR_DECLARE;
    struct uc_struct *uc = env->uc;
    MemoryRegion *mr;

    /* Handle CPU specific unaligned behaviour */
    if (addr & ((1 << a_bits) - 1)) {
        cpu_unaligned_access(env_cpu(env), addr, access_type,
                             mmu_idx, retaddr);
    }

    /* If the TLB entry is for a different page, reload and try again.  */
    if (!tlb_hit(env->uc, tlb_addr, addr)) {
        if (!victim_tlb_hit(env, mmu_idx, index, tlb_off,
                            addr & TARGET_PAGE_MASK)) {
            tlb_fill(env_cpu(env), addr, size,
                     access_type, mmu_idx, retaddr);
            index = tlb_index(env, mmu_idx, addr);
            entry = tlb_entry(env, mmu_idx, addr);
        }
        tlb_addr = code_read ? entry->addr_code : entry->addr_read;
        tlb_addr &= ~TLB_INVALID_MASK;
    }

    paddr = entry->paddr | (addr & ~TARGET_PAGE_MASK);
    mr = uc->memory_mapping(uc, paddr);

    // memory might be still unmapped while reading or fetching
    if (mr == NULL) {
        handled = false;
        // if there is already an unhandled eror, skip callbacks.
        if (uc->invalid_error == UC_ERR_OK) {
            if (code_read) {
                // code fetching
                error_code = UC_ERR_FETCH_UNMAPPED;
                HOOK_FOREACH(uc, hook, UC_HOOK_MEM_FETCH_UNMAPPED) {
                    if (hook->to_delete)
                        continue;
                    if (!HOOK_BOUND_CHECK(hook, paddr))
                        continue;
                    if ((handled = ((uc_cb_eventmem_t)hook->callback)(uc, UC_MEM_FETCH_UNMAPPED, paddr, size, 0, hook->user_data)))
                        break;

                    // the last callback may already asked to stop emulation
                    if (uc->stop_request)
                        break;
                }
            } else {
                // data reading
                error_code = UC_ERR_READ_UNMAPPED;
                HOOK_FOREACH(uc, hook, UC_HOOK_MEM_READ_UNMAPPED) {
                    if (hook->to_delete)
                        continue;
                    if (!HOOK_BOUND_CHECK(hook, paddr))
                        continue;
                    if ((handled = ((uc_cb_eventmem_t)hook->callback)(uc, UC_MEM_READ_UNMAPPED, paddr, size, 0, hook->user_data)))
                        break;

                    // the last callback may already asked to stop emulation
                    if (uc->stop_request)
                        break;
                }
            }
        } else {
            error_code = uc->invalid_error;
        }

        if (handled) {
            uc->invalid_error = UC_ERR_OK;
            /* If the TLB entry is for a different page, reload and try again.  */
            if (!tlb_hit(env->uc, tlb_addr, addr)) {
                if (!victim_tlb_hit(env, mmu_idx, index, tlb_off,
                                    addr & TARGET_PAGE_MASK)) {
                    tlb_fill(env_cpu(env), addr, size,
                             access_type, mmu_idx, retaddr);
                    index = tlb_index(env, mmu_idx, addr);
                    entry = tlb_entry(env, mmu_idx, addr);
                }
                tlb_addr = code_read ? entry->addr_code : entry->addr_read;
                tlb_addr &= ~TLB_INVALID_MASK;
            }
            paddr = entry->paddr | (addr & ~TARGET_PAGE_MASK);
            mr = uc->memory_mapping(uc, paddr);
            if (mr == NULL) {
                uc->invalid_error = UC_ERR_MAP;
                if (uc->nested_level > 0 && !uc->cpu->stopped) {
                    cpu_exit(uc->cpu);
                    // XXX(@lazymio): We have to exit early so that the target register won't be overwritten
                    //                because qemu might generate tcg code like:
                    //                       qemu_ld_i64 x0,x1,leq,8  sync: 0  dead: 0 1
                    //                where we don't have a change to recover x0 value
                    cpu_loop_exit(uc->cpu);
                }
                return 0;
            }
        } else {
            uc->invalid_addr = paddr;
            uc->invalid_error = error_code;
            // printf("***** Invalid fetch (unmapped memory) at " TARGET_FMT_lx "\n", addr);
            if (uc->nested_level > 0 && !uc->cpu->stopped) {
                cpu_exit(uc->cpu);
                // See comments above
                cpu_loop_exit(uc->cpu);
            }
            return 0;
        }
    }

    // now it is read on mapped memory
    if (!code_read) {
        // this is date reading
        HOOK_FOREACH(uc, hook, UC_HOOK_MEM_READ) {
            if (hook->to_delete)
                continue;
            if (!HOOK_BOUND_CHECK(hook, paddr))
                continue;
            ((uc_cb_hookmem_t)hook->callback)(env->uc, UC_MEM_READ, paddr, size, 0, hook->user_data);

            // the last callback may already asked to stop emulation
            if (uc->stop_request)
                break;
        }

        // callback on non-readable memory
        if (mr != NULL && !(mr->perms & UC_PROT_READ)) {  //non-readable
            handled = false;
            HOOK_FOREACH(uc, hook, UC_HOOK_MEM_READ_PROT) {
                if (hook->to_delete)
                    continue;
                if (!HOOK_BOUND_CHECK(hook, paddr))
                    continue;
                if ((handled = ((uc_cb_eventmem_t)hook->callback)(uc, UC_MEM_READ_PROT, paddr, size, 0, hook->user_data)))
                    break;

                // the last callback may already asked to stop emulation
                if (uc->stop_request)
                    break;
            }

            if (handled) {
                uc->invalid_error = UC_ERR_OK;
                /* If the TLB entry is for a different page, reload and try again.  */
                if (!tlb_hit(env->uc, tlb_addr, addr)) {
                    if (!victim_tlb_hit(env, mmu_idx, index, tlb_off,
                                        addr & TARGET_PAGE_MASK)) {
                        tlb_fill(env_cpu(env), addr, size,
                                 access_type, mmu_idx, retaddr);
                        index = tlb_index(env, mmu_idx, addr);
                        entry = tlb_entry(env, mmu_idx, addr);
                    }
                    tlb_addr = code_read ? entry->addr_code : entry->addr_read;
                    tlb_addr &= ~TLB_INVALID_MASK;
                }
            } else {
                uc->invalid_addr = paddr;
                uc->invalid_error = UC_ERR_READ_PROT;
                // printf("***** Invalid memory read (non-readable) at " TARGET_FMT_lx "\n", addr);
                if (uc->nested_level > 0 && !uc->cpu->stopped) {
                    cpu_exit(uc->cpu);
                    // See comments above
                    cpu_loop_exit(uc->cpu);
                }
                return 0;
            }
        }
    } else {
        // code fetching
        // Unicorn: callback on fetch from NX
        if (mr != NULL && !(mr->perms & UC_PROT_EXEC)) {  // non-executable
            handled = false;
            HOOK_FOREACH(uc, hook, UC_HOOK_MEM_FETCH_PROT) {
                if (hook->to_delete)
                    continue;
                if (!HOOK_BOUND_CHECK(hook, paddr))
                    continue;
                if ((handled = ((uc_cb_eventmem_t)hook->callback)(uc, UC_MEM_FETCH_PROT, paddr, size, 0, hook->user_data)))
                    break;

                // the last callback may already asked to stop emulation
                if (uc->stop_request)
                    break;
            }

            if (handled) {
                uc->invalid_error = UC_ERR_OK;
            } else {
                uc->invalid_addr = paddr;
                uc->invalid_error = UC_ERR_FETCH_PROT;
                // printf("***** Invalid fetch (non-executable) at " TARGET_FMT_lx "\n", addr);
                if (uc->nested_level > 0 && !uc->cpu->stopped) {
                    cpu_exit(uc->cpu);
                    // See comments above
                    cpu_loop_exit(uc->cpu);
                }
                return 0;
            }
        }
    }

    /* Handle anything that isn't just a straight memory access.  */
    if (unlikely(tlb_addr & ~TARGET_PAGE_MASK)) {
        CPUIOTLBEntry *iotlbentry;
        bool need_swap;

        /* For anything that is unaligned, recurse through full_load.  */
        if ((addr & (size - 1)) != 0) {
            goto do_unaligned_access;
        }

        iotlbentry = &env_tlb(env)->d[mmu_idx].iotlb[index];

        /* Handle watchpoints.  */
        if (unlikely(tlb_addr & TLB_WATCHPOINT)) {
            /* On watchpoint hit, this will longjmp out.  */
            cpu_check_watchpoint(env_cpu(env), addr, size,
                                 iotlbentry->attrs, BP_MEM_READ, retaddr);
        }

        need_swap = size > 1 && (tlb_addr & TLB_BSWAP);

        /* Handle I/O access.  */
        if (likely(tlb_addr & TLB_MMIO)) {
            res = io_readx(env, iotlbentry, mmu_idx, addr, retaddr,
                            access_type, op ^ (need_swap * MO_BSWAP));
            goto _out;
        }

        haddr = (void *)((uintptr_t)addr + entry->addend);

        /*
         * Keep these two load_memop separate to ensure that the compiler
         * is able to fold the entire function to a single instruction.
         * There is a build-time assert inside to remind you of this.  ;-)
         */
        if (unlikely(need_swap)) {
            res = load_memop(haddr, op ^ MO_BSWAP);
            goto _out;
        }
        res = load_memop(haddr, op);
        goto _out;
    }

    /* Handle slow unaligned access (it spans two pages or IO).  */
    if (size > 1
        && unlikely((addr & ~TARGET_PAGE_MASK) + size - 1
                    >= TARGET_PAGE_SIZE)) {
        target_ulong addr1, addr2;
        uint64_t r1, r2;
        unsigned shift;
        int old_size;
    do_unaligned_access:
        addr1 = addr & ~((target_ulong)size - 1);
        addr2 = addr1 + size;
        old_size = uc->size_recur_mem;
        uc->size_recur_mem = size;
        r1 = full_load(env, addr1, oi, retaddr);
        r2 = full_load(env, addr2, oi, retaddr);
        uc->size_recur_mem = old_size;
        shift = (addr & (size - 1)) * 8;

        if (memop_big_endian(op)) {
            /* Big-endian combine.  */
            res = (r1 << shift) | (r2 >> ((size * 8) - shift));
        } else {
            /* Little-endian combine.  */
            res = (r1 >> shift) | (r2 << ((size * 8) - shift));
        }
        res = res & MAKE_64BIT_MASK(0, size * 8);
        goto _out;
    }

    haddr = (void *)((uintptr_t)addr + entry->addend);
    res = load_memop(haddr, op);

_out:
    // Unicorn: callback on successful data read
    if (!code_read) {
        if (!uc->size_recur_mem) { // disabling read callback if in recursive call
            HOOK_FOREACH(uc, hook, UC_HOOK_MEM_READ_AFTER) {
                if (hook->to_delete)
                    continue;
                if (!HOOK_BOUND_CHECK(hook, paddr))
                    continue;
                ((uc_cb_hookmem_t)hook->callback)(env->uc, UC_MEM_READ_AFTER, paddr, size, res, hook->user_data);

                // the last callback may already asked to stop emulation
                if (uc->stop_request)
                    break;
            }
        }
    }

    return res;
}